

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::ToPropertyDescriptor
               (Var propertySpec,PropertyDescriptor *descriptor,ScriptContext *scriptContext)

{
  bool bVar1;
  BOOL BVar2;
  int32 hCode_00;
  RecyclableObject *pRVar3;
  int32 hCode;
  ScriptContext *scriptContext_local;
  PropertyDescriptor *descriptor_local;
  Var propertySpec_local;
  
  bVar1 = VarIs<Js::JavascriptProxy>(propertySpec);
  if (bVar1) {
LAB_00faa63f:
    BVar2 = ToPropertyDescriptorForProxyObjects(propertySpec,descriptor,scriptContext);
    if (BVar2 == 0) {
      return 0;
    }
  }
  else {
    bVar1 = VarIs<Js::RecyclableObject>(propertySpec);
    if (bVar1) {
      pRVar3 = VarTo<Js::RecyclableObject>(propertySpec);
      pRVar3 = RecyclableObject::GetPrototype(pRVar3);
      bVar1 = CheckIfPrototypeChainContainsProxyObject(pRVar3);
      if (bVar1) goto LAB_00faa63f;
    }
    BVar2 = ToPropertyDescriptorForGenericObjects(propertySpec,descriptor,scriptContext);
    if (BVar2 == 0) {
      return 0;
    }
  }
  bVar1 = PropertyDescriptor::GetterSpecified(descriptor);
  if ((bVar1) || (bVar1 = PropertyDescriptor::SetterSpecified(descriptor), bVar1)) {
    bVar1 = PropertyDescriptor::ValueSpecified(descriptor);
    if (bVar1) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec43,(PCWSTR)0x0);
    }
    bVar1 = PropertyDescriptor::WritableSpecified(descriptor);
    if (bVar1) {
      bVar1 = PropertyDescriptor::IsWritable(descriptor);
      hCode_00 = -0x7ff5ec53;
      if (bVar1) {
        hCode_00 = -0x7ff5ec54;
      }
      JavascriptError::ThrowTypeError(scriptContext,hCode_00,L"writable");
    }
  }
  PropertyDescriptor::SetOriginal(descriptor,propertySpec);
  return 1;
}

Assistant:

BOOL JavascriptOperators::ToPropertyDescriptor(Var propertySpec, PropertyDescriptor* descriptor, ScriptContext* scriptContext)
    {
        if (VarIs<JavascriptProxy>(propertySpec) || (
            VarIs<RecyclableObject>(propertySpec) &&
            JavascriptOperators::CheckIfPrototypeChainContainsProxyObject(VarTo<RecyclableObject>(propertySpec)->GetPrototype())))
        {
            if (ToPropertyDescriptorForProxyObjects(propertySpec, descriptor, scriptContext) == FALSE)
            {
                return FALSE;
            }
        }
        else
        {
            if (ToPropertyDescriptorForGenericObjects(propertySpec, descriptor, scriptContext) == FALSE)
            {
                return FALSE;
            }
        }

        if (descriptor->GetterSpecified() || descriptor->SetterSpecified())
        {
            if (descriptor->ValueSpecified())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_CannotHaveAccessorsAndValue);
            }
            if (descriptor->WritableSpecified())
            {
                int32 hCode = descriptor->IsWritable() ? JSERR_InvalidAttributeTrue : JSERR_InvalidAttributeFalse;
                JavascriptError::ThrowTypeError(scriptContext, hCode, _u("writable"));
            }
        }

        descriptor->SetOriginal(propertySpec);

        return TRUE;
    }